

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O0

Trie * load_dictionary(char *fname)

{
  bool bVar1;
  istream *piVar2;
  char *__s;
  char *pcVar3;
  char *in_RSI;
  Trie *in_RDI;
  char *space;
  char *str;
  string line;
  ifstream h;
  Trie *t;
  Trie *in_stack_fffffffffffffda0;
  Trie *in_stack_fffffffffffffdb0;
  istream local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  Trie::Trie(in_stack_fffffffffffffda0);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffdb0);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_218,(string *)&stack0xfffffffffffffdb0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    __s = (char *)std::__cxx11::string::c_str();
    pcVar3 = strchr(__s,0x20);
    if (pcVar3 == (char *)0x0) {
      Trie::insert(in_stack_fffffffffffffdb0,__s,0);
    }
    else {
      *pcVar3 = '\0';
      pcVar3 = pcVar3 + 1;
      atof(__s);
      Trie::insert(in_stack_fffffffffffffdb0,__s,(size_t)pcVar3);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

Trie load_dictionary(const char* fname)
{ ifstream h(fname);
  Trie t;
  string line;
  while (getline(h,line))
  { const char* str = line.c_str();
    char* space = (char*)strchr(str, ' ');
    if (space)
    { *space = 0;
      space++;
      t.insert(space, atof(str));
    }
    else
      t.insert(str);
  }
  return t;
}